

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainFrame.c
# Opt level: O2

void Abc_FrameCheckPoConstTest(Abc_Frame_t *p)

{
  uint uVar1;
  uint i;
  
  for (i = 0; (int)i < p->pNtkCur->vPos->nSize; i = i + 1) {
    Abc_NtkPo(p->pNtkCur,i);
    uVar1 = Abc_FrameCheckPoConst(p,i);
    printf("%d = %d\n",(ulong)i,(ulong)uVar1);
  }
  return;
}

Assistant:

void Abc_FrameCheckPoConstTest( Abc_Frame_t * p )
{
    Abc_Obj_t * pObj;
    int i;
    Abc_NtkForEachPo( p->pNtkCur, pObj, i )
        printf( "%d = %d\n", i, Abc_FrameCheckPoConst(p, i) );
}